

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManWriter.cpp
# Opt level: O3

void __thiscall adios2::core::engine::DataManWriter::~DataManWriter(DataManWriter *this)

{
  pointer pcVar1;
  int in_ESI;
  
  (this->super_Engine)._vptr_Engine = (_func_int **)&PTR__DataManWriter_008753d0;
  if ((this->super_Engine).m_IsClosed == false) {
    DoClose(this,in_ESI);
  }
  std::
  deque<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::shared_ptr<std::vector<char,_std::allocator<char>_>_>_>_>
  ::~deque(&(this->m_BufferQueue).c);
  if (((this->m_PublishThread)._M_id._M_thread == 0) && ((this->m_ReplyThread)._M_id._M_thread == 0)
     ) {
    pcVar1 = (this->m_Monitor).m_TransportMethod._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->m_Monitor).m_TransportMethod.field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->m_Monitor).m_CompressionMethod._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->m_Monitor).m_CompressionMethod.field_2) {
      operator_delete(pcVar1);
    }
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              (&(this->m_Monitor).m_LatencyMilliseconds.
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base
              ((_Deque_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &(this->m_Monitor).m_TotalBytes);
    std::
    _Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ::~_Deque_base((_Deque_base<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                    *)&(this->m_Monitor).m_StepTimers);
    zmq::ZmqReqRep::~ZmqReqRep(&this->m_Replier);
    zmq::ZmqPubSub::~ZmqPubSub(&this->m_Publisher);
    adios2::format::DataManSerializer::~DataManSerializer(&this->m_Serializer);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&this->m_HandshakeJson);
    pcVar1 = (this->m_FloatAccuracy)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->m_FloatAccuracy).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->m_TransportMode)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->m_TransportMode).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (this->m_IPAddress)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(this->m_IPAddress).field_2) {
      operator_delete(pcVar1);
    }
    Engine::~Engine(&this->super_Engine);
    return;
  }
  std::terminate();
}

Assistant:

DataManWriter::~DataManWriter()
{
    if (not m_IsClosed)
    {
        DoClose();
    }
}